

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

char * llvm::printNode(Node *RootNode,char *Buf,size_t *N)

{
  bool bVar1;
  OutputStream S;
  OutputStream local_38;
  
  local_38.CurrentPackIndex = 0xffffffff;
  local_38.CurrentPackMax = 0xffffffff;
  bVar1 = anon_unknown.dwarf_18d51b::initializeOutputStream(Buf,N,&local_38,0x80);
  if (bVar1) {
    local_38.Buffer = (char *)0x0;
  }
  else {
    anon_unknown.dwarf_18d51b::Node::print(RootNode,&local_38);
    OutputStream::operator+=(&local_38,'\0');
    if (N != (size_t *)0x0) {
      *N = local_38.CurrentPosition;
    }
  }
  return local_38.Buffer;
}

Assistant:

static char *printNode(Node *RootNode, char *Buf, size_t *N) {
  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;
  RootNode->print(S);
  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}